

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::ValidateTestPropertyName
               (string *property_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reserved_names)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((reserved_names->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (reserved_names->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish,property_name);
  local_60 = (reserved_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_58 != local_60) {
    Message::Message((Message *)&local_68);
    std::operator<<((ostream *)(local_68.ptr_ + 0x10),"Reserved key used in RecordProperty(): ");
    std::operator<<((ostream *)(local_68.ptr_ + 0x10),(string *)property_name);
    std::operator<<((ostream *)(local_68.ptr_ + 0x10)," (");
    Message::Message((Message *)&local_70);
    lVar3 = 0;
    for (uVar2 = 0;
        uVar1 = (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5, uVar2 < uVar1;
        uVar2 = uVar2 + 1) {
      if ((uVar2 != 0) && (2 < uVar1)) {
        std::operator<<((ostream *)&(local_70.data_)->line,", ");
        uVar1 = (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar2 == uVar1 - 1) {
        std::operator<<((ostream *)&(local_70.data_)->line,"and ");
      }
      std::operator<<((ostream *)&(local_70.data_)->line,"\'");
      std::operator<<((ostream *)&(local_70.data_)->line,
                      (string *)
                      ((long)&(((reserved_names->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar3));
      std::operator<<((ostream *)&(local_70.data_)->line,"\'");
      lVar3 = lVar3 + 0x20;
    }
    internal::StringStreamToString(&local_50,(stringstream *)local_70.data_);
    internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
    std::operator<<((ostream *)(local_68.ptr_ + 0x10),(string *)&local_50);
    std::operator<<((ostream *)(local_68.ptr_ + 0x10)," are reserved by ");
    std::operator<<((ostream *)(local_68.ptr_ + 0x10),"Google Test");
    std::operator<<((ostream *)(local_68.ptr_ + 0x10),")");
    internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kagami-c[P]PPData/3rdparty/googletest-release-1.7.0/src/gtest.cc"
               ,0x71e,"Failed");
    internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  return local_58 == local_60;
}

Assistant:

bool ValidateTestPropertyName(const std::string& property_name,
                              const std::vector<std::string>& reserved_names) {
  if (std::find(reserved_names.begin(), reserved_names.end(), property_name) !=
          reserved_names.end()) {
    ADD_FAILURE() << "Reserved key used in RecordProperty(): " << property_name
                  << " (" << FormatWordList(reserved_names)
                  << " are reserved by " << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}